

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_number.cpp
# Opt level: O3

void __thiscall
Number_N10DefaultBase8_Test<char>::~Number_N10DefaultBase8_Test
          (Number_N10DefaultBase8_Test<char> *this)

{
  anon_unknown.dwarf_1160b1::Number<char>::~Number(&this->super_Number<char>);
  operator_delete(this,400);
  return;
}

Assistant:

TYPED_TEST (Number, N10DefaultBase8) {
    pstore::dump::number_base::oct ();
    pstore::dump::number_long v (10);
    v.write (this->out_);
    auto const & actual = this->out_.str ();
    auto const & expected = convert<TypeParam> ("012");
    EXPECT_EQ (expected, actual);
}